

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall testing::internal::FilePath::RemoveFileName(FilePath *this)

{
  char *buffer;
  char *pcVar1;
  size_t extraout_RDX;
  FilePath *in_RSI;
  FilePath FVar2;
  String dir;
  String local_38;
  String local_20;
  
  pcVar1 = FindLastPathSeparator(in_RSI);
  local_38.c_str_ = (char *)0x0;
  local_38.length_ = 0;
  if (pcVar1 == (char *)0x0) {
    String::operator=(&local_38,"./");
  }
  else {
    buffer = (in_RSI->pathname_).c_str_;
    String::ConstructNonNull(&local_20,buffer,(size_t)(pcVar1 + (1 - (long)buffer)));
    String::operator=(&local_38,&local_20);
    String::~String(&local_20);
  }
  FilePath(this,&local_38);
  String::~String(&local_38);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  String dir;
  if (last_sep) {
    dir = String(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}